

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O2

void __thiscall ktx::CommandTranscode::executeTranscode(CommandTranscode *this)

{
  Reporter *report;
  istream *stream;
  char cVar1;
  int iVar2;
  char *in_RCX;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 testrun;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *filepath;
  string_view filepath_00;
  string_view fmt;
  format_args args;
  KTXTexture2 texture;
  OutputStream outputFile;
  char *local_488;
  size_type local_480;
  char local_478 [8];
  undefined8 uStack_470;
  path outputPath;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  string writerScParams;
  string writer;
  InputStream inputStream;
  
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream
            (&inputStream,&(this->options).super_OptionsSingleInSingleOut.inputFilepath,report);
  stream = inputStream.activeStream;
  filepath_00._M_str = in_RCX;
  filepath_00._M_len =
       (size_t)(this->options).super_OptionsSingleInSingleOut.inputFilepath._M_dataplus._M_p;
  fmtInFile_abi_cxx11_
            ((string *)&ktx2Stream,
             (ktx *)(this->options).super_OptionsSingleInSingleOut.inputFilepath._M_string_length,
             filepath_00);
  validateToolInput(stream,(string *)&ktx2Stream,report);
  std::__cxx11::string::~string((string *)&ktx2Stream);
  texture.handle_ = (ktxTexture2 *)0x0;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
            (&ktx2Stream,
             *(basic_streambuf<char,_std::char_traits<char>_> **)
              (inputStream.activeStream +
              *(long *)(*(long *)inputStream.activeStream + -0x18) + 0xe8),_S_in|_S_bin);
  iVar2 = ktxTexture2_CreateFromStream
                    (ktx2Stream._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&texture);
  if (iVar2 != 0) {
    outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar2);
    Reporter::fatal<char_const(&)[34],char_const*>
              (report,INVALID_FILE,(char (*) [34])"Failed to create KTX2 texture: {}",
               (char **)&outputPath);
  }
  cVar1 = ktxTexture2_NeedsTranscoding(texture.handle_);
  if (cVar1 == '\0') {
    Reporter::fatal<char_const(&)[30]>(report,INVALID_FILE,(char (*) [30])0x1de4a0);
  }
  transcode<true>((ktx *)&outputPath,&texture,&(this->options).super_OptionsTranscodeTarget<true>,
                  report);
  texture.handle_ = (ktxTexture2 *)outputPath._M_pathname._M_dataplus._M_p;
  outputPath._M_pathname._M_dataplus._M_p = (pointer)0x0;
  KTXTexture2::~KTXTexture2((KTXTexture2 *)&outputPath);
  testrun = extraout_DL;
  if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar2 = ktxTexture2_DeflateZstd
                      (texture.handle_,
                       (this->options).super_OptionsDeflate.zstd.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    testrun = extraout_DL_00;
    if (iVar2 != 0) {
      outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar2);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,DFD_FAILURE,(char (*) [37])"Zstd deflation failed. KTX Error: {}",
                 (char **)&outputPath);
      testrun = extraout_DL_01;
    }
  }
  if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar2 = ktxTexture2_DeflateZLIB
                      (texture.handle_,
                       (this->options).super_OptionsDeflate.zlib.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    testrun = extraout_DL_02;
    if (iVar2 != 0) {
      outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar2);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,DFD_FAILURE,(char (*) [37])"ZLIB deflation failed. KTX Error: {}",
                 (char **)&outputPath);
      testrun = extraout_DL_03;
    }
  }
  version_abi_cxx11_(&outputFile.filepath,(ktx *)(ulong)(this->options).super_OptionsGeneric.testrun
                     ,(bool)testrun);
  outputPath._M_pathname._M_dataplus._M_p =
       (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
  outputPath._M_pathname._M_string_length =
       (this->super_Command).super_Reporter.commandName._M_string_length;
  outputPath._M_pathname.field_2._M_allocated_capacity =
       (size_type)outputFile.filepath._M_dataplus._M_p;
  outputPath._M_pathname.field_2._8_8_ = outputFile.filepath._M_string_length;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x5;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&outputPath;
  ::fmt::v10::vformat_abi_cxx11_(&writer,(v10 *)0x1d8e91,fmt,args);
  std::__cxx11::string::~string((string *)&outputFile);
  ktxHashList_DeleteKVPair(&(texture.handle_)->kvDataHead,"KTXwriter");
  ktxHashList_AddKVPair
            (&(texture.handle_)->kvDataHead,"KTXwriter",(int)writer._M_string_length + 1,
             writer._M_dataplus._M_p);
  std::__cxx11::string::string
            ((string *)&writerScParams,(string *)&(this->options).super_OptionsDeflate);
  ktxHashList_DeleteKVPair(&(texture.handle_)->kvDataHead,"KTXwriterScParams");
  if (writerScParams._M_string_length != 0) {
    if (*writerScParams._M_dataplus._M_p != ' ') {
      __assert_fail("writerScParams[0] == \' \'",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_transcode.cpp"
                    ,0xb4,"void ktx::CommandTranscode::executeTranscode()");
    }
    ktxHashList_AddKVPair
              (&(texture.handle_)->kvDataHead,"KTXwriterScParams",writerScParams._M_string_length,
               writerScParams._M_dataplus._M_p + 1);
  }
  filepath = &(this->options).super_OptionsSingleInSingleOut.outputFilepath;
  std::__cxx11::string::string((string *)&local_488,(string *)filepath);
  outputFile.filepath._M_dataplus._M_p = (pointer)&outputFile.filepath.field_2;
  if (local_488 == local_478) {
    outputFile.filepath.field_2._8_8_ = uStack_470;
  }
  else {
    outputFile.filepath._M_dataplus._M_p = local_488;
  }
  outputFile.filepath._M_string_length = local_480;
  local_480 = 0;
  local_478[0] = '\0';
  local_488 = local_478;
  std::filesystem::__cxx11::path::path(&outputPath,&outputFile.filepath,auto_format);
  std::__cxx11::string::~string((string *)&outputFile);
  std::__cxx11::string::~string((string *)&local_488);
  cVar1 = std::filesystem::__cxx11::path::has_parent_path();
  if (cVar1 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories((path *)&outputFile);
    std::filesystem::__cxx11::path::~path((path *)&outputFile);
  }
  OutputStream::OutputStream(&outputFile,filepath,report);
  OutputStream::writeKTX2(&outputFile,(ktxTexture *)texture.handle_,report);
  OutputStream::~OutputStream(&outputFile);
  std::filesystem::__cxx11::path::~path(&outputPath);
  std::__cxx11::string::~string((string *)&writerScParams);
  std::__cxx11::string::~string((string *)&writer);
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
            (&ktx2Stream);
  KTXTexture2::~KTXTexture2(&texture);
  InputStream::~InputStream(&inputStream);
  return;
}

Assistant:

void CommandTranscode::executeTranscode() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (!ktxTexture2_NeedsTranscoding(texture))
        fatal(rc::INVALID_FILE, "KTX file is not transcodable.");

    texture = transcode(std::move(texture), options, *this);

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    // Modify KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXwriterScParams metadata if supercompression was used
    const auto writerScParams = options.compressOptions;
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}